

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O2

int xmlValidatePushElement(xmlValidCtxtPtr ctxt,xmlDocPtr doc,xmlNodePtr elem,xmlChar *qname)

{
  xmlElementPtr pxVar1;
  _xmlElementContent *p_Var2;
  int iVar3;
  xmlNodePtr pxVar4;
  xmlValidState *pxVar5;
  xmlRegExecCtxtPtr pxVar6;
  int iVar7;
  xmlParserErrors xVar8;
  char *pcVar9;
  xmlChar *pxVar10;
  xmlValidCtxtPtr pxVar11;
  xmlRegexpPtr comp;
  xmlChar *str1;
  xmlElementContentPtr pxVar12;
  int iVar13;
  int plen;
  int extsubset;
  xmlChar *local_38;
  
  extsubset = 0;
  if (ctxt == (xmlValidCtxtPtr)0x0) {
    return 0;
  }
  iVar13 = 1;
  if (((ctxt->vstateNr < 1) || (pxVar5 = ctxt->vstate, pxVar5 == (xmlValidState *)0x0)) ||
     (pxVar1 = pxVar5->elemDecl, pxVar1 == (xmlElementPtr)0x0)) goto switchD_00191bb5_caseD_2;
  switch(pxVar1->etype) {
  case XML_ELEMENT_TYPE_UNDEFINED:
    goto switchD_00191bb5_caseD_0;
  case XML_ELEMENT_TYPE_EMPTY:
    pxVar4 = pxVar5->node;
    pxVar10 = pxVar4->name;
    pcVar9 = "Element %s was declared EMPTY this one has content\n";
    xVar8 = XML_DTD_NOT_EMPTY;
    goto LAB_00191c0f;
  case XML_ELEMENT_TYPE_MIXED:
    pxVar12 = pxVar1->content;
    if ((pxVar12 == (xmlElementContentPtr)0x0) || (pxVar12->type != XML_ELEMENT_CONTENT_PCDATA)) {
      local_38 = xmlSplitQName3(qname,&plen);
      if (local_38 == (xmlChar *)0x0) {
        for (; pxVar12 != (xmlElementContentPtr)0x0; pxVar12 = pxVar12->c2) {
          if (pxVar12->type == XML_ELEMENT_CONTENT_OR) {
            p_Var2 = pxVar12->c1;
            if (p_Var2 == (_xmlElementContent *)0x0) goto LAB_00191d72;
            if (p_Var2->type != XML_ELEMENT_CONTENT_PCDATA) {
              if (p_Var2->type != XML_ELEMENT_CONTENT_ELEMENT) goto LAB_00191d72;
              if (p_Var2->prefix == (xmlChar *)0x0) {
                pxVar10 = p_Var2->name;
                goto LAB_00191d54;
              }
            }
          }
          else {
            if (pxVar12->type != XML_ELEMENT_CONTENT_ELEMENT) {
LAB_00191d72:
              pxVar11 = (xmlValidCtxtPtr)0x0;
              goto LAB_00191d74;
            }
            if (pxVar12->prefix != (xmlChar *)0x0) goto LAB_00191d62;
            pxVar10 = pxVar12->name;
LAB_00191d54:
            iVar3 = xmlStrEqual(pxVar10,qname);
            if (iVar3 != 0) goto switchD_00191bb5_caseD_2;
          }
LAB_00191d62:
        }
      }
      else {
        for (; pxVar12 != (xmlElementContentPtr)0x0; pxVar12 = pxVar12->c2) {
          pxVar11 = ctxt;
          if (pxVar12->type == XML_ELEMENT_CONTENT_OR) {
            p_Var2 = pxVar12->c1;
            if (p_Var2 == (_xmlElementContent *)0x0) goto LAB_00191d74;
            if (p_Var2->type != XML_ELEMENT_CONTENT_PCDATA) {
              if (p_Var2->type != XML_ELEMENT_CONTENT_ELEMENT) goto LAB_00191d74;
              if ((p_Var2->prefix != (xmlChar *)0x0) &&
                 (iVar3 = xmlStrncmp(p_Var2->prefix,qname,plen), iVar3 == 0)) {
                pxVar10 = pxVar12->c1->name;
                goto LAB_00191cfe;
              }
            }
          }
          else {
            if (pxVar12->type != XML_ELEMENT_CONTENT_ELEMENT) goto LAB_00191d74;
            if ((pxVar12->prefix != (xmlChar *)0x0) &&
               (iVar3 = xmlStrncmp(pxVar12->prefix,qname,plen), iVar3 == 0)) {
              pxVar10 = pxVar12->name;
LAB_00191cfe:
              iVar3 = xmlStrEqual(pxVar10,local_38);
              if (iVar3 != 0) goto switchD_00191bb5_caseD_2;
            }
          }
        }
      }
      goto LAB_00191d87;
    }
    pxVar4 = pxVar5->node;
    pxVar10 = pxVar4->name;
    pcVar9 = "Element %s was declared #PCDATA but contains non text nodes\n";
    xVar8 = XML_DTD_NOT_PCDATA;
LAB_00191c0f:
    iVar13 = 0;
    xmlErrValidNode(ctxt,pxVar4,xVar8,pcVar9,pxVar10,(xmlChar *)0x0,(xmlChar *)0x0);
    break;
  case XML_ELEMENT_TYPE_ELEMENT:
    if ((pxVar5->exec != (xmlRegExecCtxtPtr)0x0) &&
       (iVar3 = xmlRegExecPushString(pxVar5->exec,qname,(void *)0x0), iVar3 < 0)) {
      pxVar4 = pxVar5->node;
      pcVar9 = "Element %s content does not follow the DTD, Misplaced %s\n";
      xVar8 = XML_DTD_CONTENT_MODEL;
      str1 = pxVar4->name;
      pxVar10 = qname;
      goto LAB_00191da8;
    }
  }
switchD_00191bb5_caseD_2:
  pxVar4 = (xmlNodePtr)xmlValidGetElemDecl(ctxt,doc,elem,&extsubset);
  iVar3 = ctxt->vstateMax;
  if ((iVar3 == 0) || (pxVar5 = ctxt->vstateTab, pxVar5 == (xmlValidState *)0x0)) {
    ctxt->vstateMax = 10;
    pxVar5 = (xmlValidState *)(*xmlMalloc)(0xf0);
    ctxt->vstateTab = pxVar5;
    if (pxVar5 == (xmlValidState *)0x0) {
      pcVar9 = "malloc failed";
      goto LAB_00191e9b;
    }
    iVar3 = ctxt->vstateMax;
  }
  iVar7 = ctxt->vstateNr;
  if (iVar3 <= iVar7) {
    pxVar5 = (xmlValidState *)(*xmlRealloc)(pxVar5,(long)(iVar3 * 2) * 0x18);
    if (pxVar5 == (xmlValidState *)0x0) {
      pcVar9 = "realloc failed";
LAB_00191e9b:
      xmlVErrMemory(ctxt,pcVar9);
      return iVar13;
    }
    ctxt->vstateMax = ctxt->vstateMax << 1;
    ctxt->vstateTab = pxVar5;
    iVar7 = ctxt->vstateNr;
  }
  ctxt->vstate = pxVar5 + iVar7;
  pxVar5[iVar7].elemDecl = (xmlElementPtr)pxVar4;
  pxVar5[iVar7].node = elem;
  if ((pxVar4 != (xmlNodePtr)0x0) && (*(int *)&pxVar4->ns == 4)) {
    comp = (xmlRegexpPtr)pxVar4->psvi;
    if (comp == (xmlRegexpPtr)0x0) {
      xmlValidBuildContentModel(ctxt,(xmlElementPtr)pxVar4);
      comp = (xmlRegexpPtr)pxVar4->psvi;
      if (comp == (xmlRegexpPtr)0x0) {
        ctxt->vstateTab[ctxt->vstateNr].exec = (xmlRegExecCtxtPtr)0x0;
        xmlErrValidNode(ctxt,pxVar4,XML_ERR_INTERNAL_ERROR,
                        "Failed to build content model regexp for %s\n",elem->name,(xmlChar *)0x0,
                        (xmlChar *)0x0);
        iVar7 = ctxt->vstateNr;
        goto LAB_00191e84;
      }
    }
    pxVar6 = xmlRegNewExecCtxt(comp,(xmlRegExecCallbacks)0x0,(void *)0x0);
    iVar7 = ctxt->vstateNr;
    ctxt->vstateTab[iVar7].exec = pxVar6;
  }
LAB_00191e84:
  ctxt->vstateNr = iVar7 + 1;
  return iVar13;
LAB_00191d74:
  xmlErrValid(pxVar11,XML_DTD_MIXED_CORRUPT,"Internal: MIXED struct corrupted\n",(char *)0x0);
LAB_00191d87:
  pxVar4 = pxVar5->node;
  pxVar10 = pxVar4->name;
  pcVar9 = "Element %s is not declared in %s list of possible children\n";
  xVar8 = XML_DTD_INVALID_CHILD;
  str1 = qname;
LAB_00191da8:
  xmlErrValidNode(ctxt,pxVar4,xVar8,pcVar9,str1,pxVar10,(xmlChar *)0x0);
switchD_00191bb5_caseD_0:
  iVar13 = 0;
  goto switchD_00191bb5_caseD_2;
}

Assistant:

int
xmlValidatePushElement(xmlValidCtxtPtr ctxt, xmlDocPtr doc,
                       xmlNodePtr elem, const xmlChar *qname) {
    int ret = 1;
    xmlElementPtr eDecl;
    int extsubset = 0;

    if (ctxt == NULL)
        return(0);
/* printf("PushElem %s\n", qname); */
    if ((ctxt->vstateNr > 0) && (ctxt->vstate != NULL)) {
	xmlValidStatePtr state = ctxt->vstate;
	xmlElementPtr elemDecl;

	/*
	 * Check the new element against the content model of the new elem.
	 */
	if (state->elemDecl != NULL) {
	    elemDecl = state->elemDecl;

	    switch(elemDecl->etype) {
		case XML_ELEMENT_TYPE_UNDEFINED:
		    ret = 0;
		    break;
		case XML_ELEMENT_TYPE_EMPTY:
		    xmlErrValidNode(ctxt, state->node,
				    XML_DTD_NOT_EMPTY,
	       "Element %s was declared EMPTY this one has content\n",
			   state->node->name, NULL, NULL);
		    ret = 0;
		    break;
		case XML_ELEMENT_TYPE_ANY:
		    /* I don't think anything is required then */
		    break;
		case XML_ELEMENT_TYPE_MIXED:
		    /* simple case of declared as #PCDATA */
		    if ((elemDecl->content != NULL) &&
			(elemDecl->content->type ==
			 XML_ELEMENT_CONTENT_PCDATA)) {
			xmlErrValidNode(ctxt, state->node,
					XML_DTD_NOT_PCDATA,
	       "Element %s was declared #PCDATA but contains non text nodes\n",
				state->node->name, NULL, NULL);
			ret = 0;
		    } else {
			ret = xmlValidateCheckMixed(ctxt, elemDecl->content,
				                    qname);
			if (ret != 1) {
			    xmlErrValidNode(ctxt, state->node,
					    XML_DTD_INVALID_CHILD,
	       "Element %s is not declared in %s list of possible children\n",
				    qname, state->node->name, NULL);
			}
		    }
		    break;
		case XML_ELEMENT_TYPE_ELEMENT:
		    /*
		     * TODO:
		     * VC: Standalone Document Declaration
		     *     - element types with element content, if white space
		     *       occurs directly within any instance of those types.
		     */
		    if (state->exec != NULL) {
			ret = xmlRegExecPushString(state->exec, qname, NULL);
			if (ret < 0) {
			    xmlErrValidNode(ctxt, state->node,
					    XML_DTD_CONTENT_MODEL,
	       "Element %s content does not follow the DTD, Misplaced %s\n",
				   state->node->name, qname, NULL);
			    ret = 0;
			} else {
			    ret = 1;
			}
		    }
		    break;
	    }
	}
    }
    eDecl = xmlValidGetElemDecl(ctxt, doc, elem, &extsubset);
    vstateVPush(ctxt, eDecl, elem);
    return(ret);
}